

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O1

void zddPrintCoverAux(DdManager *zdd,DdNode *node,int level,int *list)

{
  DdNode *node_00;
  DdNode *pDVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
LAB_0091db96:
  do {
    if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
      if (zdd->one != node) {
        return;
      }
      if (zdd->sizeZ == level) {
        if (0 < zdd->sizeZ) {
          lVar4 = 0;
          do {
            iVar2 = list[lVar4] * 4 + list[lVar4 + 1];
            if (iVar2 == 0) {
              iVar2 = 0x2d;
            }
            else if (iVar2 == 1) {
              iVar2 = 0x30;
            }
            else if (iVar2 == 4) {
              iVar2 = 0x31;
            }
            else {
              iVar2 = 0x40;
            }
            putc(iVar2,(FILE *)zdd->out);
            lVar4 = lVar4 + 2;
          } while ((int)lVar4 < zdd->sizeZ);
        }
        fwrite(" 1\n",3,1,(FILE *)zdd->out);
        return;
      }
    }
    else {
      uVar3 = (ulong)node->index;
      iVar2 = 0x7fffffff;
      if (uVar3 != 0x7fffffff) {
        iVar2 = zdd->permZ[uVar3];
      }
      if (iVar2 == level) break;
    }
    list[zdd->invpermZ[level]] = 0;
    level = level + 1;
  } while( true );
  node_00 = (node->type).kids.T;
  pDVar1 = (node->type).kids.E;
  level = level + 1;
  if (node_00 == pDVar1) {
    list[uVar3] = 2;
    node = pDVar1;
  }
  else {
    list[uVar3] = 1;
    zddPrintCoverAux(zdd,node_00,level,list);
    list[node->index] = 0;
    node = pDVar1;
  }
  goto LAB_0091db96;
}

Assistant:

static void
zddPrintCoverAux(
  DdManager * zdd /* manager */,
  DdNode * node /* current node */,
  int  level /* depth in the recursion */,
  int * list /* current recursion path */)
{
    DdNode      *Nv, *Nnv;
    int         i, v;
    DdNode      *base = DD_ONE(zdd);

    if (Cudd_IsConstant(node)) {
        if (node == base) {
            /* Check for missing variable. */
            if (level != zdd->sizeZ) {
                list[zdd->invpermZ[level]] = 0;
                zddPrintCoverAux(zdd, node, level + 1, list);
                return;
            }
            /* Terminal case: Print one cube based on the current recursion
            ** path.
            */
            for (i = 0; i < zdd->sizeZ; i += 2) {
                v = list[i] * 4 + list[i+1];
                if (v == 0)
                    (void) putc('-',zdd->out);
                else if (v == 4)
                    (void) putc('1',zdd->out);
                else if (v == 1)
                    (void) putc('0',zdd->out);
                else
                    (void) putc('@',zdd->out); /* should never happen */
            }
            (void) fprintf(zdd->out," 1\n");
        }
    } else {
        /* Check for missing variable. */
        if (level != cuddIZ(zdd,node->index)) {
            list[zdd->invpermZ[level]] = 0;
            zddPrintCoverAux(zdd, node, level + 1, list);
            return;
        }

        Nnv = cuddE(node);
        Nv = cuddT(node);
        if (Nv == Nnv) {
            list[node->index] = 2;
            zddPrintCoverAux(zdd, Nnv, level + 1, list);
            return;
        }

        list[node->index] = 1;
        zddPrintCoverAux(zdd, Nv, level + 1, list);
        list[node->index] = 0;
        zddPrintCoverAux(zdd, Nnv, level + 1, list);
    }
    return;

}